

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::VariableStatement<tcu::Matrix<float,_3,_3>_>::doExecute
          (VariableStatement<tcu::Matrix<float,_3,_3>_> *this,EvalContext *ctx)

{
  Environment *this_00;
  Variable<tcu::Matrix<float,_3,_3>_> *variable;
  Expr<tcu::Matrix<float,_3,_3>_> *pEVar1;
  IVal *this_01;
  Matrix<tcu::Interval,_3,_3> MStack_f8;
  
  if (this->m_isDeclaration == true) {
    this_00 = ctx->env;
    variable = (this->m_variable).
               super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>.
               m_ptr;
    pEVar1 = (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_3,_3>_>.
             super_ExprPBase<tcu::Matrix<float,_3,_3>_>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_>.m_ptr;
    (*(pEVar1->super_ExprBase)._vptr_ExprBase[4])(&MStack_f8,pEVar1,ctx);
    Environment::bind<tcu::Matrix<float,3,3>>(this_00,variable,&MStack_f8);
  }
  else {
    pEVar1 = (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_3,_3>_>.
             super_ExprPBase<tcu::Matrix<float,_3,_3>_>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_>.m_ptr;
    (*(pEVar1->super_ExprBase)._vptr_ExprBase[4])(&MStack_f8,pEVar1,ctx);
    this_01 = Environment::lookup<tcu::Matrix<float,3,3>>
                        (ctx->env,(this->m_variable).
                                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>
                                  .m_ptr);
    tcu::Matrix<tcu::Interval,_3,_3>::operator=(this_01,&MStack_f8);
  }
  return;
}

Assistant:

void			doExecute			(EvalContext& ctx)						const
	{
		if (m_isDeclaration)
			ctx.env.bind(*m_variable, m_value->evaluate(ctx));
		else
			ctx.env.lookup(*m_variable) = m_value->evaluate(ctx);
	}